

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 soft_f32_div(float32 a,float32 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float32 fVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  
  FVar12 = float32_unpack_raw(a);
  FVar12 = sf_canonicalize(FVar12,&float32_params,status);
  uVar10 = FVar12._8_8_;
  uVar9 = FVar12.frac;
  FVar13 = float32_unpack_raw(b);
  FVar13 = sf_canonicalize(FVar13,&float32_params,status);
  uVar5 = FVar13._8_8_;
  uVar11 = FVar13.frac;
  uVar8 = (uVar5 ^ uVar10) & 0x10000000000;
  uVar6 = FVar12._12_4_ & 0xff;
  uVar4 = FVar13._12_4_ & 0xff;
  if ((uVar6 == 2) && (uVar4 == 2)) {
    uVar5 = (ulong)((FVar12.exp - FVar13.exp) - (uint)(uVar9 < uVar11));
    lVar7 = 0;
    if (uVar11 <= uVar9) {
      lVar7 = uVar9 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11 * 2;
    auVar2._8_8_ = uVar9 >> (uVar11 <= uVar9);
    auVar2._0_8_ = lVar7;
    uVar9 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar10 = uVar10 & 0xffff00ff00000000;
  }
  else {
    if (((uVar10 | uVar5) & 0xfc00000000) != 0) {
      FVar13._8_8_ = uVar5 & 0xffffffffffff;
      FVar13.frac = uVar11;
      FVar12 = pick_nan(FVar12,FVar13,status);
      goto LAB_00b167fe;
    }
    if (((uVar10 >> 0x20 & 1) != 0) && (uVar6 == uVar4)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      FVar12.exp = 0x7fffffff;
      FVar12.cls = float_class_qnan;
      FVar12.sign = false;
      FVar12._14_2_ = 0;
      FVar12.frac = 0x2000000000000000;
      goto LAB_00b167fe;
    }
    if ((uVar10 >> 0x20 & 1) != 0) {
      uVar8 = uVar8 | uVar10 & 0xffff0003ffffffff;
      FVar12.exp = (int)uVar8;
      FVar12.cls = (char)(uVar8 >> 0x20);
      FVar12.sign = (_Bool)(char)(uVar8 >> 0x28);
      FVar12._14_2_ = (short)(uVar8 >> 0x30);
      FVar12.frac = uVar9;
      goto LAB_00b167fe;
    }
    if (uVar4 == 3) {
      uVar11 = uVar10 & 0xffff0000ffffffff | uVar8 | 0x100000000;
      FVar12.exp = (int)uVar11;
      FVar12.cls = (char)(uVar11 >> 0x20);
      FVar12.sign = (_Bool)(char)(uVar11 >> 0x28);
      FVar12._14_2_ = (short)(uVar11 >> 0x30);
      FVar12.frac = uVar9;
      goto LAB_00b167fe;
    }
    if (uVar4 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    status->float_exception_flags = status->float_exception_flags | 4;
    uVar10 = uVar10 & 0xffff0000ffffffff;
    uVar5 = 0x300000000;
  }
  uVar8 = uVar5 | uVar10 | uVar8;
  FVar12.exp = (int)uVar8;
  FVar12.cls = (char)(uVar8 >> 0x20);
  FVar12.sign = (_Bool)(char)(uVar8 >> 0x28);
  FVar12._14_2_ = (short)(uVar8 >> 0x30);
  FVar12.frac = uVar9;
LAB_00b167fe:
  FVar12 = round_canonical(FVar12,status,&float32_params);
  fVar3 = float32_pack_raw(FVar12);
  return fVar3;
}

Assistant:

static float32 QEMU_SOFTFLOAT_ATTR
soft_f32_div(float32 a, float32 b, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pb = float32_unpack_canonical(b, status);
    FloatParts pr = div_floats(pa, pb, status);

    return float32_round_pack_canonical(pr, status);
}